

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRGraphicsWindowNode::VRGraphicsWindowNode
          (VRGraphicsWindowNode *this,string *name,VRGraphicsToolkit *gfxToolkit,
          VRWindowToolkit *winToolkit,VRWindowSettings *settings)

{
  long *plVar1;
  undefined4 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  VRWindowSettings *in_stack_fffffffffffffd78;
  VRWindowSettings *in_stack_fffffffffffffd80;
  value_type *in_stack_fffffffffffffd88;
  value_type *__x;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *in_stack_fffffffffffffd98;
  VRDisplayNode *in_stack_fffffffffffffda0;
  allocator<char> *in_stack_fffffffffffffdb0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffdb8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_1d9 [40];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [32];
  undefined1 local_a0 [128];
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  VRDisplayNode::VRDisplayNode(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  *in_RDI = &PTR__VRGraphicsWindowNode_001bd5a0;
  in_RDI[0xf] = local_18;
  in_RDI[0x10] = local_20;
  VRWindowSettings::VRWindowSettings(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  plVar1 = (long *)in_RDI[0x10];
  VRWindowSettings::VRWindowSettings(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  uVar2 = (**(code **)(*plVar1 + 0x18))(plVar1,local_a0);
  *(undefined4 *)(in_RDI + 0xe) = uVar2;
  VRWindowSettings::~VRWindowSettings((VRWindowSettings *)0x1704f9);
  (**(code **)(*(long *)in_RDI[0x10] + 0x38))
            ((long *)in_RDI[0x10],*(undefined4 *)(in_RDI + 0xe),in_RDI + 0x1e,(long)in_RDI + 0xf4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  __a = (allocator<char> *)(in_RDI + 8);
  __s = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  this_00 = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  __x = (value_type *)local_1d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,__x);
  std::__cxx11::string::~string((string *)(local_1d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d9);
  return;
}

Assistant:

VRGraphicsWindowNode::VRGraphicsWindowNode(const std::string &name, VRGraphicsToolkit *gfxToolkit, VRWindowToolkit *winToolkit, const VRWindowSettings &settings) : 
  VRDisplayNode(name), _gfxToolkit(gfxToolkit), _winToolkit(winToolkit), _settings(settings)
{
  _windowID = _winToolkit->createWindow(_settings);
  _winToolkit->getFramebufferSize(_windowID, _framebufferWidth, _framebufferHeight);
  _valuesAdded.push_back("WindowX");
  _valuesAdded.push_back("WindowY");
  _valuesAdded.push_back("WindowWidth");
  _valuesAdded.push_back("WindowHeight");
  _valuesAdded.push_back("FramebufferWidth");
  _valuesAdded.push_back("FramebufferHeight");
  _valuesAdded.push_back("SharedContextId");
  _valuesAdded.push_back("WindowID");

}